

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.h
# Opt level: O2

void __thiscall
cm::uv_handle_ptr_base_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_tty_ptr,void>
          (uv_handle_ptr_base_<uv_stream_s> *this,uv_tty_ptr *rhs)

{
  __shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  (this->handle).super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->handle).super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28._M_ptr = uv_tty_ptr::operator_cast_to_uv_stream_s_(rhs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
            (&local_28._M_refcount,
             &(rhs->super_uv_handle_ptr_<uv_tty_s>).super_uv_handle_ptr_base_<uv_tty_s>.handle.
              super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2> *)this,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2> *)rhs);
  return;
}

Assistant:

uv_handle_ptr_base_(S&& rhs)
  {
    // This will force a compiler error if rhs doesn't have a casting
    // operator to get T*
    this->handle = std::shared_ptr<T>(rhs.handle, rhs);
    rhs.handle.reset();
  }